

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog>::operator()
          (StairsRenderer<ImPlot::GetterXsYs<float>,_ImPlot::TransformerLinLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  ImVec2 IVar2;
  ImU32 IVar3;
  uint uVar4;
  GetterXsYs<float> *pGVar5;
  TransformerLinLog *pTVar6;
  ImPlotPlot *pIVar7;
  ImDrawVert *pIVar8;
  uint *puVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [12];
  ImPlotContext *pIVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  pIVar13 = GImPlot;
  pGVar5 = this->Getter;
  pTVar6 = this->Transformer;
  iVar14 = pGVar5->Count;
  lVar15 = (long)(((pGVar5->Offset + prim + 1) % iVar14 + iVar14) % iVar14) * (long)pGVar5->Stride;
  fVar20 = *(float *)((long)pGVar5->Xs + lVar15);
  dVar10 = log10((double)*(float *)((long)pGVar5->Ys + lVar15) /
                 GImPlot->CurrentPlot->YAxis[pTVar6->YAxis].Range.Min);
  iVar14 = pTVar6->YAxis;
  pIVar7 = pIVar13->CurrentPlot;
  dVar1 = pIVar7->YAxis[iVar14].Range.Min;
  IVar2 = pIVar13->PixelRange[iVar14].Min;
  fVar16 = (float)(pIVar13->Mx * ((double)fVar20 - (pIVar7->XAxis).Range.Min) + (double)IVar2.x);
  fVar17 = (float)(pIVar13->My[iVar14] *
                   (((double)(float)(dVar10 / pIVar13->LogDenY[iVar14]) *
                     (pIVar7->YAxis[iVar14].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  fVar18 = (this->P1).x;
  fVar19 = (this->P1).y;
  auVar21._0_4_ = ~-(uint)(fVar16 <= fVar18) & (uint)fVar16;
  auVar21._4_4_ = ~-(uint)(fVar17 <= fVar19) & (uint)fVar17;
  auVar21._8_4_ = ~-(uint)(fVar18 < fVar16) & (uint)fVar16;
  auVar21._12_4_ = ~-(uint)(fVar19 < fVar17) & (uint)fVar17;
  auVar11._4_4_ = (uint)fVar19 & -(uint)(fVar17 <= fVar19);
  auVar11._0_4_ = (uint)fVar18 & -(uint)(fVar16 <= fVar18);
  auVar11._8_4_ = (uint)fVar18 & -(uint)(fVar18 < fVar16);
  auVar11._12_4_ = (uint)fVar19 & -(uint)(fVar19 < fVar17);
  auVar21 = auVar21 | auVar11;
  fVar20 = (cull_rect->Min).y;
  auVar12._4_8_ = auVar21._8_8_;
  auVar12._0_4_ = -(uint)(auVar21._4_4_ < fVar20);
  auVar22._0_8_ = auVar12._0_8_ << 0x20;
  auVar22._8_4_ = -(uint)(auVar21._8_4_ < (cull_rect->Max).x);
  auVar22._12_4_ = -(uint)(auVar21._12_4_ < (cull_rect->Max).y);
  auVar23._4_4_ = -(uint)(fVar20 < auVar21._4_4_);
  auVar23._0_4_ = -(uint)((cull_rect->Min).x < auVar21._0_4_);
  auVar23._8_8_ = auVar22._8_8_;
  iVar14 = movmskps((int)pIVar7,auVar23);
  if (iVar14 == 0xf) {
    fVar20 = fVar19 + this->HalfWeight;
    fVar19 = fVar19 - this->HalfWeight;
    IVar3 = this->Col;
    IVar2 = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    (pIVar8->pos).x = fVar18;
    (pIVar8->pos).y = fVar20;
    DrawList->_VtxWritePtr->uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar3;
    pIVar8[1].pos.x = fVar16;
    pIVar8[1].pos.y = fVar19;
    DrawList->_VtxWritePtr[1].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar3;
    pIVar8[2].pos.x = fVar18;
    pIVar8[2].pos.y = fVar19;
    pIVar8[2].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar3;
    pIVar8[3].pos.x = fVar16;
    pIVar8[3].pos.y = fVar20;
    pIVar8[3].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9 = DrawList->_IdxWritePtr;
    *puVar9 = uVar4;
    puVar9[1] = uVar4 + 1;
    puVar9[2] = DrawList->_VtxCurrentIdx + 2;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9[3] = uVar4;
    puVar9[4] = uVar4 + 1;
    puVar9[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar9 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar19 = fVar16 - this->HalfWeight;
    fVar18 = this->HalfWeight + fVar16;
    fVar20 = (this->P1).y;
    IVar3 = this->Col;
    IVar2 = *uv;
    pIVar8[4].pos.x = fVar19;
    pIVar8[4].pos.y = fVar17;
    DrawList->_VtxWritePtr->uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = IVar3;
    pIVar8[1].pos.x = fVar18;
    pIVar8[1].pos.y = fVar20;
    DrawList->_VtxWritePtr[1].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = IVar3;
    pIVar8[2].pos.x = fVar19;
    pIVar8[2].pos.y = fVar20;
    pIVar8[2].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = IVar3;
    pIVar8[3].pos.x = fVar18;
    pIVar8[3].pos.y = fVar17;
    pIVar8[3].uv = IVar2;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = IVar3;
    DrawList->_VtxWritePtr = pIVar8 + 4;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9 = DrawList->_IdxWritePtr;
    *puVar9 = uVar4;
    puVar9[1] = uVar4 + 1;
    puVar9[2] = DrawList->_VtxCurrentIdx + 2;
    uVar4 = DrawList->_VtxCurrentIdx;
    puVar9[3] = uVar4;
    puVar9[4] = uVar4 + 1;
    puVar9[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar9 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar2.y = fVar17;
  IVar2.x = fVar16;
  this->P1 = IVar2;
  return (char)iVar14 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }